

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void showProcessInfo(void)

{
  int *piVar1;
  long lVar2;
  ostream *poVar3;
  iterator __end1;
  list<Process_*,_std::allocator<Process_*>_> *plVar4;
  
  printSplitLine();
  poVar3 = std::operator<<((ostream *)&std::cout,"main process info:");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"\tnum: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,"details: ");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"\tpid \tname\t\t\tmem");
  plVar4 = &processList_abi_cxx11_;
  while( true ) {
    std::endl<char,std::char_traits<char>>(poVar3);
    plVar4 = (list<Process_*,_std::allocator<Process_*>_> *)
             (plVar4->super__List_base<Process_*,_std::allocator<Process_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (plVar4 == &processList_abi_cxx11_) break;
    piVar1 = *(int **)((long)plVar4 + 0x10);
    poVar3 = std::operator<<((ostream *)&std::cout,"\t");
    lVar2 = *(long *)poVar3;
    *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) | 0x20;
    *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x10) = 7;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar1);
    poVar3 = std::operator<<(poVar3," ");
    lVar2 = *(long *)poVar3;
    *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) | 0x20;
    *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x10) = 0xf;
    poVar3 = std::operator<<(poVar3,(char *)(piVar1 + 1));
    poVar3 = std::operator<<(poVar3," ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) | 0x20;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(*(long *)(piVar1 + 0xe) + 4));
  }
  if (processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl._M_node
      ._M_size == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\tnone");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  printSplitLine();
  return;
}

Assistant:

void showProcessInfo() {
    printSplitLine();
    // 先输出进程数量
    cout << "main process info:" << endl;
    cout << "\tnum: " << processList.size() << endl;
    cout << endl;
    // 输出线程详情
    cout << "details: " << endl;
    cout << "\tpid \tname\t\t\tmem" << endl;
    for (Process *i : processList)
        cout << "\t" << setiosflags(ios::left) << setw(7) << i->pid
             << " " << setiosflags(ios::left) << setw(15) << i->name
             << " " << setiosflags(ios::left) << i->memBlock->length
             << endl;
    if (processList.size() == 0) cout << "\tnone" << endl;
    printSplitLine();
}